

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManCreate(Tim_Man_t *p,void *pLib,Vec_Flt_t *vInArrs,Vec_Flt_t *vOutReqs)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  float *pfVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  float fVar8;
  Vec_Ptr_t *local_60;
  int local_58;
  int local_54;
  int k;
  int i;
  float *pTable;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  If_Box_t *pIfBox;
  If_LibBox_t *pLibBox;
  Vec_Flt_t *vOutReqs_local;
  Vec_Flt_t *vInArrs_local;
  void *pLib_local;
  Tim_Man_t *p_local;
  
  if (p->vDelayTables != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDelayTables == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x19e,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  if (pLib == (void *)0x0) {
    local_60 = Vec_PtrAlloc(100);
  }
  else {
    iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pLib + 8));
    local_60 = Vec_PtrStart(iVar1);
  }
  p->vDelayTables = local_60;
  if (p->vBoxes != (Vec_Ptr_t *)0x0) {
    for (local_54 = 0; iVar1 = Vec_PtrSize(p->vBoxes), local_54 < iVar1; local_54 = local_54 + 1) {
      pvVar3 = Vec_PtrEntry(p->vBoxes,local_54);
      if ((*(int *)((long)pvVar3 + 0x10) == -1) || (pLib == (void *)0x0)) {
        pfVar4 = (float *)malloc((long)(*(int *)((long)pvVar3 + 8) * *(int *)((long)pvVar3 + 0xc) +
                                       3) << 2);
        *pfVar4 = (float)*(int *)((long)pvVar3 + 0x10);
        pfVar4[1] = (float)*(int *)((long)pvVar3 + 8);
        pfVar4[2] = (float)*(int *)((long)pvVar3 + 0xc);
        for (local_58 = 0; local_58 < *(int *)((long)pvVar3 + 8) * *(int *)((long)pvVar3 + 0xc);
            local_58 = local_58 + 1) {
          pfVar4[local_58 + 3] = 1.0;
        }
        iVar1 = Vec_PtrSize(p->vDelayTables);
        *(int *)((long)pvVar3 + 0x10) = iVar1;
        Vec_PtrPush(p->vDelayTables,pfVar4);
      }
      else {
        if ((*(int *)((long)pvVar3 + 0x10) < 0) ||
           (iVar1 = *(int *)((long)pvVar3 + 0x10),
           iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pLib + 8)), iVar2 <= iVar1)) {
          __assert_fail("pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b1,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        pvVar5 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pLib + 8),*(int *)((long)pvVar3 + 0x10));
        if (pvVar5 == (void *)0x0) {
          __assert_fail("pIfBox != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b3,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        if (*(int *)((long)pvVar5 + 0x10) != *(int *)((long)pvVar3 + 8)) {
          __assert_fail("pIfBox->nPis == pBox->nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b4,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        if (*(int *)((long)pvVar5 + 0x14) != *(int *)((long)pvVar3 + 0xc)) {
          __assert_fail("pIfBox->nPos == pBox->nOutputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b5,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        *(int *)((long)pvVar3 + 0x18) = (int)*(char *)((long)pvVar5 + 9);
        pvVar6 = Vec_PtrEntry(p->vDelayTables,*(int *)((long)pvVar3 + 0x10));
        if (pvVar6 == (void *)0x0) {
          pfVar4 = (float *)malloc((long)(*(int *)((long)pvVar3 + 8) * *(int *)((long)pvVar3 + 0xc)
                                         + 3) << 2);
          *pfVar4 = (float)*(int *)((long)pvVar3 + 0x10);
          pfVar4[1] = (float)*(int *)((long)pvVar3 + 8);
          pfVar4[2] = (float)*(int *)((long)pvVar3 + 0xc);
          for (local_58 = 0; local_58 < *(int *)((long)pvVar3 + 8) * *(int *)((long)pvVar3 + 0xc);
              local_58 = local_58 + 1) {
            pfVar4[local_58 + 3] =
                 (float)*(int *)(*(long *)((long)pvVar5 + 0x18) + (long)local_58 * 4);
          }
          Vec_PtrWriteEntry(p->vDelayTables,*(int *)((long)pvVar3 + 0x10),pfVar4);
        }
      }
    }
  }
  if (vInArrs != (Vec_Flt_t *)0x0) {
    iVar1 = Vec_FltSize(vInArrs);
    iVar2 = Tim_ManPiNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_FltSize(vInArrs) == Tim_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1c6,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    local_54 = 0;
    while( true ) {
      bVar7 = false;
      if (local_54 < p->nCis) {
        pTable = (float *)(p->pCis + local_54);
        bVar7 = (Tim_Obj_t *)pTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if ((int)pTable[2] < 0) {
        fVar8 = Vec_FltEntry(vInArrs,local_54);
        pTable[4] = fVar8;
      }
      local_54 = local_54 + 1;
    }
  }
  if (vOutReqs != (Vec_Flt_t *)0x0) {
    local_58 = 0;
    iVar1 = Vec_FltSize(vOutReqs);
    iVar2 = Tim_ManPoNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_FltSize(vOutReqs) == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1cf,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    local_54 = 0;
    while( true ) {
      bVar7 = false;
      if (local_54 < p->nCos) {
        pTable = (float *)(p->pCos + local_54);
        bVar7 = (Tim_Obj_t *)pTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if ((int)pTable[2] < 0) {
        fVar8 = Vec_FltEntry(vOutReqs,local_58);
        pTable[5] = fVar8;
        local_58 = local_58 + 1;
      }
      local_54 = local_54 + 1;
    }
    iVar1 = Tim_ManPoNum(p);
    if (local_58 != iVar1) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1d2,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
  }
  return;
}

Assistant:

void Tim_ManCreate( Tim_Man_t * p, void * pLib, Vec_Flt_t * vInArrs, Vec_Flt_t * vOutReqs )
{
    If_LibBox_t * pLibBox = (If_LibBox_t *)pLib;
    If_Box_t * pIfBox;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pTable;
    int i, k;
    assert( p->vDelayTables == NULL );
    p->vDelayTables = pLibBox ? Vec_PtrStart( Vec_PtrSize(pLibBox->vBoxes) ) : Vec_PtrAlloc( 100 );
    if ( p->vBoxes )
    Tim_ManForEachBox( p, pBox, i )
    {
        if ( pBox->iDelayTable == -1 || pLibBox == NULL )
        {
            // create table with constants
            pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
            pTable[0] = pBox->iDelayTable;
            pTable[1] = pBox->nInputs;
            pTable[2] = pBox->nOutputs;
            for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
                pTable[3 + k] = 1.0;
            // save table
            pBox->iDelayTable = Vec_PtrSize(p->vDelayTables);
            Vec_PtrPush( p->vDelayTables, pTable );
            continue;
        }
        assert( pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes) );
        pIfBox = (If_Box_t *)Vec_PtrEntry( pLibBox->vBoxes, pBox->iDelayTable );
        assert( pIfBox != NULL );
        assert( pIfBox->nPis == pBox->nInputs );
        assert( pIfBox->nPos == pBox->nOutputs );
        pBox->fBlack = pIfBox->fBlack;
        if ( Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable ) != NULL )
            continue;
        // create table of boxes
        pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
        pTable[0] = pBox->iDelayTable;
        pTable[1] = pBox->nInputs;
        pTable[2] = pBox->nOutputs;
        for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
            pTable[3 + k] = pIfBox->pDelays[k];
        // save table
        Vec_PtrWriteEntry( p->vDelayTables, pBox->iDelayTable, pTable );
    }
    // create arrival times
    if ( vInArrs )
    {
        assert( Vec_FltSize(vInArrs) == Tim_ManPiNum(p) );
        Tim_ManForEachPi( p, pObj, i )
            pObj->timeArr = Vec_FltEntry(vInArrs, i);

    }
    // create required times
    if ( vOutReqs )
    {
        k = 0;
        assert( Vec_FltSize(vOutReqs) == Tim_ManPoNum(p) );
        Tim_ManForEachPo( p, pObj, i )
            pObj->timeReq = Vec_FltEntry(vOutReqs, k++);
        assert( k == Tim_ManPoNum(p) );
    }
}